

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt8Cnf(word *t,int nVars,int *pCover)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  int nCubes;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  word uRes [4];
  
  local_68 = (uint)*t ^ 0xffffffff;
  uStack_64 = *(uint *)((long)t + 4) ^ 0xffffffff;
  uStack_60 = (uint)t[1] ^ 0xffffffff;
  uStack_5c = *(uint *)((long)t + 0xc) ^ 0xffffffff;
  local_58 = (uint)t[2] ^ 0xffffffff;
  uStack_54 = *(uint *)((long)t + 0x14) ^ 0xffffffff;
  uStack_50 = (uint)t[3] ^ 0xffffffff;
  uStack_4c = *(uint *)((long)t + 0x1c) ^ 0xffffffff;
  nCubes = 0;
  Abc_Tt8IsopCover(t,t,nVars,uRes,pCover,&nCubes);
  bVar1 = (char)nVars * '\x02';
  uVar2 = 0;
  uVar3 = (ulong)(uint)nCubes;
  if (nCubes < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pCover[uVar2] = pCover[uVar2] | 1 << (bVar1 & 0x1f);
  }
  Abc_Tt8IsopCover((word *)&local_68,(word *)&local_68,nVars,uRes,pCover,&nCubes);
  for (; (long)uVar3 < (long)nCubes; uVar3 = uVar3 + 1) {
    pCover[uVar3] = pCover[uVar3] | 2 << (bVar1 & 0x1f);
  }
  if (nCubes < 0x101) {
    return nCubes;
  }
  __assert_fail("nCubes <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xa14,"int Abc_Tt8Cnf(word *, int, int *)");
}

Assistant:

static inline int Abc_Tt8Cnf( word t[4], int nVars, int * pCover )
{
    word uRes[4], tc[4] = {~t[0], ~t[1], ~t[2], ~t[3]};
    int c, nCubes = 0;
    Abc_Tt8IsopCover( t,  t,  nVars, uRes, pCover, &nCubes );
    for ( c = 0; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+0));
    Abc_Tt8IsopCover( tc, tc, nVars, uRes, pCover, &nCubes );
    for ( ; c < nCubes; c++ )
        pCover[c] |= (1 << (2*nVars+1));
    assert( nCubes <= 256 );
    return nCubes;
}